

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg2.hpp
# Opt level: O2

void __thiscall trng::mrg2::backward(mrg2 *this)

{
  int iVar1;
  int32_t iVar2;
  int iVar3;
  
  iVar2 = (this->P).a[1];
  if (iVar2 == 0) {
    iVar2 = (this->P).a[0];
    if (iVar2 == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = (this->S).r[1];
      iVar2 = int_math::modulo_inverse(iVar2,0x7fffffff);
      iVar1 = (int)(((long)iVar2 * (long)iVar1) % 0x7fffffff);
    }
  }
  else {
    iVar3 = (this->S).r[0] - (int)(((long)(this->S).r[1] * (long)(this->P).a[0]) % 0x7fffffff);
    iVar1 = iVar3 + 0x7fffffff;
    if (-1 < iVar3) {
      iVar1 = iVar3;
    }
    iVar2 = int_math::modulo_inverse(iVar2,0x7fffffff);
    iVar1 = (int)(((long)iVar2 * (long)iVar1) % 0x7fffffff);
  }
  (this->S).r[0] = (this->S).r[1];
  (this->S).r[1] = iVar1;
  return;
}

Assistant:

TRNG_CUDA_ENABLE
  inline void mrg2::backward() {
    result_type t;
    if (P.a[1] != 0) {
      t = S.r[0];
      t -= static_cast<result_type>(
          (static_cast<int64_t>(P.a[0]) * static_cast<int64_t>(S.r[1])) % modulus);
      if (t < 0)
        t += modulus;
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[1], modulus))) %
          modulus);
    } else if (P.a[0] != 0) {
      t = S.r[1];
      t = static_cast<result_type>(
          (static_cast<int64_t>(t) *
           static_cast<int64_t>(int_math::modulo_inverse(P.a[0], modulus))) %
          modulus);
    } else
      t = 0;
    S.r[0] = S.r[1];
    S.r[1] = t;
  }